

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportModel(HModel *this)

{
  HModel *in_RDI;
  HModel *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_0000001c;
  HModel *in_stack_00000020;
  HModel *XrowUpper;
  
  XrowUpper = in_RDI;
  printf("util_reportModel\n");
  util_reportModelDimensions(unaff_retaddr);
  util_reportModelObjSense(in_RDI);
  if (in_RDI->numTot < 0x65) {
    util_reportColVec(in_stack_00000020,in_stack_0000001c,
                      (vector<double,_std::allocator<double>_> *)this,
                      (vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_0000000c,in_stack_00000008),
                      (vector<double,_std::allocator<double>_> *)unaff_retaddr);
    util_reportRowVec(this,in_stack_0000000c,
                      (vector<double,_std::allocator<double>_> *)unaff_retaddr,
                      (vector<double,_std::allocator<double>_> *)XrowUpper);
    util_reportColMtx(in_stack_00000020,in_stack_0000001c,(vector<int,_std::allocator<int>_> *)this,
                      (vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_0000000c,in_stack_00000008),
                      (vector<double,_std::allocator<double>_> *)unaff_retaddr);
  }
  return;
}

Assistant:

void HModel::util_reportModel() {
#ifdef JAJH_dev
  printf("util_reportModel\n");
#endif
  util_reportModelDimensions();
  util_reportModelObjSense();
  if (numTot>100) return;
  util_reportColVec(numCol, colCost, colLower, colUpper);
  util_reportRowVec(numRow, rowLower, rowUpper);
  util_reportColMtx(numCol, Astart, Aindex, Avalue);
}